

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O3

void __thiscall jrtplib::RTPUDPv6Transmitter::Destroy(RTPUDPv6Transmitter *this)

{
  RTPMemoryManager *pRVar1;
  HashElement *pHVar2;
  HashElement *pHVar3;
  HashElement *pHVar4;
  HashElement *pHVar5;
  
  if ((this->init == true) && (this->created == true)) {
    if (this->localhostname != (uint8_t *)0x0) {
      pRVar1 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
      if (pRVar1 == (RTPMemoryManager *)0x0) {
        operator_delete__(this->localhostname);
      }
      else {
        (**(code **)(*(long *)pRVar1 + 0x18))();
      }
      this->localhostname = (uint8_t *)0x0;
      this->localhostnamelength = 0;
    }
    close(this->rtpsock);
    close(this->rtcpsock);
    memset((this->destinations).table,0,0x103e8);
    pHVar4 = (this->destinations).firsthashelem;
    while (pHVar4 != (HashElement *)0x0) {
      pHVar2 = pHVar4->listnext;
      pRVar1 = (this->destinations).super_RTPMemoryObject.mgr;
      if (pRVar1 == (RTPMemoryManager *)0x0) {
        operator_delete(pHVar4,0x60);
        pHVar4 = pHVar2;
      }
      else {
        (**(code **)(*(long *)pRVar1 + 0x18))();
        pHVar4 = pHVar2;
      }
    }
    (this->destinations).firsthashelem = (HashElement *)0x0;
    (this->destinations).lasthashelem = (HashElement *)0x0;
    memset((this->multicastgroups).table,0,0x103e8);
    pHVar5 = (this->multicastgroups).firsthashelem;
    while (pHVar5 != (HashElement *)0x0) {
      pHVar3 = pHVar5->listnext;
      pRVar1 = (this->multicastgroups).super_RTPMemoryObject.mgr;
      if (pRVar1 == (RTPMemoryManager *)0x0) {
        operator_delete(pHVar5,0x38);
        pHVar5 = pHVar3;
      }
      else {
        (**(code **)(*(long *)pRVar1 + 0x18))(pRVar1,pHVar5);
        pHVar5 = pHVar3;
      }
    }
    (this->multicastgroups).firsthashelem = (HashElement *)0x0;
    (this->multicastgroups).lasthashelem = (HashElement *)0x0;
    FlushPackets(this);
    ClearAcceptIgnoreInfo(this);
    std::__cxx11::list<in6_addr,_std::allocator<in6_addr>_>::clear(&this->localIPs);
    this->created = false;
    if (this->waitingfordata == true) {
      RTPAbortDescriptors::SendAbortSignal(this->m_pAbortDesc);
    }
    RTPAbortDescriptors::Destroy(&this->m_abortDesc);
    return;
  }
  return;
}

Assistant:

void RTPUDPv6Transmitter::Destroy()
{
	if (!init)
		return;

	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK;
		return;
	}

	if (localhostname)
	{
		RTPDeleteByteArray(localhostname,GetMemoryManager());
		localhostname = 0;
		localhostnamelength = 0;
	}
	
	RTPCLOSE(rtpsock);
	RTPCLOSE(rtcpsock);
	destinations.Clear();
#ifdef RTP_SUPPORT_IPV6MULTICAST
	multicastgroups.Clear();
#endif // RTP_SUPPORT_IPV6MULTICAST
	FlushPackets();
	ClearAcceptIgnoreInfo();
	localIPs.clear();
	created = false;
	
	if (waitingfordata)
	{
		m_pAbortDesc->SendAbortSignal();
		m_abortDesc.Destroy(); // Doesn't do anything if not initialized
		MAINMUTEX_UNLOCK
		WAITMUTEX_LOCK // to make sure that the WaitForIncomingData function ended
		WAITMUTEX_UNLOCK
	}
	else
		m_abortDesc.Destroy(); // Doesn't do anything if not initialized

	MAINMUTEX_UNLOCK
}